

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.cpp
# Opt level: O0

pair<BigInteger,_BigInteger> * ext_gcd(BigInteger *a,BigInteger *b)

{
  bool bVar1;
  pair<BigInteger,_BigInteger> *in_RDI;
  BigInteger beta;
  BigInteger alpha;
  BigInteger t;
  BigInteger s;
  BigInteger v;
  BigInteger u;
  BigInteger *in_stack_fffffffffffffce8;
  BigInteger *in_stack_fffffffffffffcf0;
  undefined1 *in_stack_fffffffffffffcf8;
  BigInteger *in_stack_fffffffffffffd00;
  BigInteger *in_stack_fffffffffffffd08;
  pair<BigInteger,_BigInteger> *in_stack_fffffffffffffd10;
  BigInteger *in_stack_fffffffffffffd60;
  BigInteger *in_stack_fffffffffffffd68;
  byte local_289;
  BigInteger *in_stack_fffffffffffffd98;
  BigInteger *in_stack_fffffffffffffda0;
  BigInteger local_248;
  pair<BigInteger,_BigInteger> local_228 [5];
  BigInteger local_e8;
  BigInteger local_b8;
  BigInteger local_98;
  BigInteger local_78 [3];
  
  BigInteger::BigInteger(in_stack_fffffffffffffd00,(longlong)in_stack_fffffffffffffcf8);
  BigInteger::BigInteger(in_stack_fffffffffffffd00,(longlong)in_stack_fffffffffffffcf8);
  BigInteger::BigInteger(in_stack_fffffffffffffd00,(longlong)in_stack_fffffffffffffcf8);
  BigInteger::BigInteger(in_stack_fffffffffffffd00,(longlong)in_stack_fffffffffffffcf8);
  while( true ) {
    bVar1 = BigInteger::odd(in_stack_fffffffffffffcf0);
    local_289 = 0;
    if (!bVar1) {
      bVar1 = BigInteger::odd(in_stack_fffffffffffffcf0);
      local_289 = bVar1 ^ 0xff;
    }
    if ((local_289 & 1) == 0) break;
    in_stack_fffffffffffffd68 = &local_b8;
    BigInteger::BigInteger(in_stack_fffffffffffffd00,(longlong)in_stack_fffffffffffffcf8);
    BigInteger::operator/=(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    BigInteger::~BigInteger((BigInteger *)0x14f2f9);
    in_stack_fffffffffffffd60 = &local_e8;
    BigInteger::BigInteger(in_stack_fffffffffffffd00,(longlong)in_stack_fffffffffffffcf8);
    BigInteger::operator/=(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    BigInteger::~BigInteger((BigInteger *)0x14f331);
  }
  BigInteger::BigInteger(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  BigInteger::BigInteger(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  while (bVar1 = BigInteger::odd(in_stack_fffffffffffffcf0), ((bVar1 ^ 0xffU) & 1) != 0) {
    BigInteger::BigInteger(in_stack_fffffffffffffd00,(longlong)in_stack_fffffffffffffcf8);
    BigInteger::operator/=(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    BigInteger::~BigInteger((BigInteger *)0x14f402);
    bVar1 = BigInteger::odd(in_stack_fffffffffffffcf0);
    if ((bVar1) || (bVar1 = BigInteger::odd(in_stack_fffffffffffffcf0), bVar1)) {
      BigInteger::operator+=(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      BigInteger::BigInteger(in_stack_fffffffffffffd00,(longlong)in_stack_fffffffffffffcf8);
      BigInteger::operator/=(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
      BigInteger::~BigInteger((BigInteger *)0x14f594);
      BigInteger::operator-=(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      BigInteger::BigInteger(in_stack_fffffffffffffd00,(longlong)in_stack_fffffffffffffcf8);
      BigInteger::operator/=(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
      BigInteger::~BigInteger((BigInteger *)0x14f5e3);
    }
    else {
      BigInteger::BigInteger(in_stack_fffffffffffffd00,(longlong)in_stack_fffffffffffffcf8);
      BigInteger::operator/=(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
      BigInteger::~BigInteger((BigInteger *)0x14f464);
      BigInteger::BigInteger(in_stack_fffffffffffffd00,(longlong)in_stack_fffffffffffffcf8);
      BigInteger::operator/=(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
      BigInteger::~BigInteger((BigInteger *)0x14f49c);
    }
  }
  while (bVar1 = operator!=(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8), bVar1) {
    bVar1 = BigInteger::odd(in_stack_fffffffffffffcf0);
    if (bVar1) {
      bVar1 = operator<(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      if (bVar1) {
        BigInteger::swap(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
        BigInteger::swap(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
        BigInteger::swap(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      }
      else {
        BigInteger::operator-=(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
        BigInteger::operator-=(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
        BigInteger::operator-=(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      }
    }
    else {
      BigInteger::BigInteger(in_stack_fffffffffffffd00,(longlong)in_stack_fffffffffffffcf8);
      BigInteger::operator/=(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
      BigInteger::~BigInteger((BigInteger *)0x14f6a3);
      bVar1 = BigInteger::odd(in_stack_fffffffffffffcf0);
      if ((bVar1) || (bVar1 = BigInteger::odd(in_stack_fffffffffffffcf0), bVar1)) {
        in_stack_fffffffffffffd00 = local_78;
        BigInteger::operator+=(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
        in_stack_fffffffffffffd08 = &local_248;
        BigInteger::BigInteger(in_stack_fffffffffffffd00,(longlong)in_stack_fffffffffffffcf8);
        BigInteger::operator/=(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
        BigInteger::~BigInteger((BigInteger *)0x14f803);
        in_stack_fffffffffffffcf0 = &local_98;
        BigInteger::operator-=(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
        in_stack_fffffffffffffcf8 = &stack0xfffffffffffffd98;
        BigInteger::BigInteger(in_stack_fffffffffffffd00,(longlong)in_stack_fffffffffffffcf8);
        BigInteger::operator/=(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
        BigInteger::~BigInteger((BigInteger *)0x14f852);
      }
      else {
        BigInteger::BigInteger(in_stack_fffffffffffffd00,(longlong)in_stack_fffffffffffffcf8);
        BigInteger::operator/=(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
        BigInteger::~BigInteger((BigInteger *)0x14f705);
        in_stack_fffffffffffffd10 = local_228;
        BigInteger::BigInteger(in_stack_fffffffffffffd00,(longlong)in_stack_fffffffffffffcf8);
        BigInteger::operator/=(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
        BigInteger::~BigInteger((BigInteger *)0x14f73d);
      }
    }
  }
  std::pair<BigInteger,_BigInteger>::pair<BigInteger_&,_BigInteger_&,_true>
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  BigInteger::~BigInteger((BigInteger *)0x14f973);
  BigInteger::~BigInteger((BigInteger *)0x14f980);
  BigInteger::~BigInteger((BigInteger *)0x14f98d);
  BigInteger::~BigInteger((BigInteger *)0x14f99a);
  BigInteger::~BigInteger((BigInteger *)0x14f9a7);
  BigInteger::~BigInteger((BigInteger *)0x14f9b4);
  return in_RDI;
}

Assistant:

std::pair<BigInteger, BigInteger> ext_gcd(BigInteger a, BigInteger b)
{
    BigInteger u = 1, v = 0, s = 0, t = 1;
    while(!a.odd() && !b.odd())
    {
        a /= 2;
        b /= 2;
    }
    BigInteger alpha = a, beta = b;
    while(!a.odd())
    {
        a /= 2;
        if(!u.odd() && !b.odd())
        {
            u /= 2;
            v /= 2;
        }
        else
        {
            u += beta;
            u /= 2;
            v -= alpha;
            v /= 2;
        }
    }
    while(a != b)
    {
        if(!b.odd())
        {
            b /= 2;
            if(!s.odd() && !t.odd())
            {
                s /= 2;
                t /= 2;
            }
            else
            {
                s += beta;
                s /= 2;
                t -= alpha;
                t /= 2;
            }
        }
        else if(b < a)
        {
            a.swap(b);
            u.swap(s);
            v.swap(t);
        }
        else
        {
            b -= a;
            s -= u;
            t -= v;
        }
    }
    return {s, t};
}